

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O1

Aig_Man_t * Aig_ManDupSimple(Aig_Man_t *p)

{
  char *pcVar1;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  Aig_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  int *__dest;
  Aig_Obj_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  ulong uVar11;
  Aig_Obj_t *p1;
  long lVar12;
  
  if (p->pManTime != (void *)0x0) {
    __assert_fail("p->pManTime == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                  ,0x33,"Aig_Man_t *Aig_ManDupSimple(Aig_Man_t *)");
  }
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pName = pcVar7;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pSpec = pcVar7;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = p->nBarBufs;
  pVVar2 = p->vFlopNums;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    iVar5 = pVVar2->nSize;
    lVar12 = (long)iVar5;
    pVVar8->nSize = iVar5;
    pVVar8->nCap = iVar5;
    if (lVar12 == 0) {
      __dest = (int *)0x0;
    }
    else {
      __dest = (int *)malloc(lVar12 * 4);
    }
    pVVar8->pArray = __dest;
    memcpy(__dest,pVVar2->pArray,lVar12 << 2);
    p_00->vFlopNums = pVVar8;
  }
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar10 = p->vCis;
  if (0 < pVVar10->nSize) {
    lVar12 = 0;
    do {
      pvVar3 = pVVar10->pArray[lVar12];
      pAVar9 = Aig_ObjCreateCi(p_00);
      *(ulong *)&pAVar9->field_0x18 =
           *(ulong *)&pAVar9->field_0x18 & 0xff000000ffffffff |
           *(ulong *)((long)pvVar3 + 0x18) & 0xffffff00000000;
      *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar9;
      lVar12 = lVar12 + 1;
      pVVar10 = p->vCis;
    } while (lVar12 < pVVar10->nSize);
  }
  pVVar10 = p->vObjs;
  if (0 < pVVar10->nSize) {
    lVar12 = 0;
    do {
      pvVar3 = pVVar10->pArray[lVar12];
      if (pvVar3 != (void *)0x0) {
        uVar4 = (uint)*(undefined8 *)((long)pvVar3 + 0x18);
        if ((uVar4 & 7) == 4) {
          if (((ulong)pvVar3 & 1) != 0) goto LAB_006b1213;
          uVar11 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
          if (uVar11 == 0) {
            pAVar9 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar9 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^ *(ulong *)(uVar11 + 0x28));
          }
        }
        else {
          if ((uVar4 & 7) - 7 < 0xfffffffe) goto LAB_006b114c;
          if (((ulong)pvVar3 & 1) != 0) goto LAB_006b1213;
          uVar11 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
          if (uVar11 == 0) {
            pAVar9 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar9 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^ *(ulong *)(uVar11 + 0x28));
          }
          uVar11 = *(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe;
          if (uVar11 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar3 + 0x10) & 1) ^ *(ulong *)(uVar11 + 0x28));
          }
          pAVar9 = Aig_And(p_00,pAVar9,p1);
        }
        *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar9;
      }
LAB_006b114c:
      lVar12 = lVar12 + 1;
      pVVar10 = p->vObjs;
    } while (lVar12 < pVVar10->nSize);
  }
  pVVar10 = p->vCos;
  if (0 < pVVar10->nSize) {
    lVar12 = 0;
    do {
      pvVar3 = pVVar10->pArray[lVar12];
      if (((ulong)pvVar3 & 1) != 0) {
LAB_006b1213:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar11 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
      if (uVar11 == 0) {
        pAVar9 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar9 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^ *(ulong *)(uVar11 + 0x28));
      }
      pAVar9 = Aig_ObjCreateCo(p_00,pAVar9);
      *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar9;
      lVar12 = lVar12 + 1;
      pVVar10 = p->vCos;
    } while (lVar12 < pVVar10->nSize);
  }
  if ((p->nObjs[4] == 0) && (p->nObjs[6] + p->nObjs[5] != p_00->nObjs[6] + p_00->nObjs[5])) {
    __assert_fail("Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                  ,0x58,"Aig_Man_t *Aig_ManDupSimple(Aig_Man_t *)");
  }
  Aig_ManSetRegNum(p_00,p->nRegs);
  iVar5 = Aig_ManCheck(p_00);
  if (iVar5 == 0) {
    puts("Aig_ManDupSimple(): The check has failed.");
  }
  return p_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Duplicates the AIG manager.]

  Description [Orders nodes as follows: PIs, ANDs, POs.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Aig_ManDupSimple( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew = NULL;
    int i;
    assert( p->pManTime == NULL );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
    {
        pObjNew = Aig_ObjCreateCi( pNew );
        pObjNew->Level = pObj->Level;
        pObj->pData = pObjNew;
    }
    // duplicate internal nodes
    Aig_ManForEachObj( p, pObj, i )
        if ( Aig_ObjIsBuf(pObj) )
        {
            pObjNew = Aig_ObjChild0Copy(pObj);
            pObj->pData = pObjNew;
        }
        else if ( Aig_ObjIsNode(pObj) )
        {
            pObjNew = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
            pObj->pData = pObjNew;
        }
    // add the POs
    Aig_ManForEachCo( p, pObj, i )
    {
        pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
        pObj->pData = pObjNew;
    }
    assert( Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew) );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupSimple(): The check has failed.\n" );
    return pNew;
}